

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_initialize_edge(REF_FACELIFT ref_facelift)

{
  int iVar1;
  uint uVar2;
  REF_INT local_84;
  REF_INT local_80;
  int local_7c;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT item;
  REF_INT node;
  REF_INT edge_geom;
  REF_INT node_geom;
  REF_INT i;
  REF_DBL edge_xyz [3];
  REF_DBL local_38;
  REF_DBL node_xyz [3];
  REF_GEOM ref_geom;
  REF_FACELIFT ref_facelift_local;
  
  node_xyz[2] = (REF_DBL)ref_facelift->grid->geom;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x183,"ref_facelift_initialize_edge","requires indirect facelift");
    ref_facelift_local._4_4_ = 1;
  }
  else {
    for (node = 0; node < *(int *)((long)node_xyz[2] + 4); node = node + 1) {
      if (*(int *)(*(long *)((long)node_xyz[2] + 0x10) + (long)(node * 6) * 4) == 0) {
        uVar2 = ref_egads_eval((REF_GEOM)node_xyz[2],node,&local_38,(REF_DBL *)0x0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x188,"ref_facelift_initialize_edge",(ulong)uVar2,"eval node");
          return uVar2;
        }
        iVar1 = *(int *)(*(long *)((long)node_xyz[2] + 0x10) + (long)(node * 6 + 5) * 4);
        if ((iVar1 < 0) || (**(int **)((long)node_xyz[2] + 0x60) <= iVar1)) {
          local_7c = -1;
        }
        else {
          local_7c = *(int *)(*(long *)(*(long *)((long)node_xyz[2] + 0x60) + 8) + (long)iVar1 * 4);
        }
        ref_private_macro_code_rss_1 = local_7c;
        if (local_7c == -1) {
          local_80 = -1;
        }
        else {
          local_80 = *(REF_INT *)
                      (*(long *)(*(long *)((long)node_xyz[2] + 0x60) + 0x10) + 4 +
                      (long)local_7c * 8);
        }
        item = local_80;
        while (ref_private_macro_code_rss_1 != -1) {
          if ((*(int *)(*(long *)((long)node_xyz[2] + 0x10) + (long)(item * 6) * 4) == 1) &&
             (ref_facelift->strong_bc[item] == 0)) {
            uVar2 = ref_egads_eval((REF_GEOM)node_xyz[2],item,(REF_DBL *)&node_geom,(REF_DBL *)0x0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x18d,"ref_facelift_initialize_edge",(ulong)uVar2,"eval face");
              return uVar2;
            }
            ref_facelift->strong_bc[item] = 1;
            for (edge_geom = 0; edge_geom < 3; edge_geom = edge_geom + 1) {
              ref_facelift->displacement[edge_geom + item * 3] =
                   node_xyz[(long)edge_geom + -1] - *(double *)(&node_geom + (long)edge_geom * 2);
            }
          }
          ref_private_macro_code_rss_1 =
               *(int *)(*(long *)(*(long *)((long)node_xyz[2] + 0x60) + 0x10) +
                       (long)ref_private_macro_code_rss_1 * 8);
          if (ref_private_macro_code_rss_1 == -1) {
            local_84 = -1;
          }
          else {
            local_84 = *(REF_INT *)
                        (*(long *)(*(long *)((long)node_xyz[2] + 0x60) + 0x10) + 4 +
                        (long)ref_private_macro_code_rss_1 * 8);
          }
          item = local_84;
        }
      }
    }
    for (edge_geom = 0; edge_geom < 100; edge_geom = edge_geom + 1) {
      uVar2 = ref_facelift_solve_edge(ref_facelift);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x197,"ref_facelift_initialize_edge",(ulong)uVar2,"solve");
        return uVar2;
      }
    }
    ref_facelift_local._4_4_ = 0;
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_initialize_edge(
    REF_FACELIFT ref_facelift) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DBL node_xyz[3], edge_xyz[3];
  REF_INT i, node_geom, edge_geom, node, item;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  /* also displace edge and face to geom nodes */

  each_ref_geom_node(ref_geom, node_geom) {
    RSS(ref_egads_eval(ref_geom, node_geom, node_xyz, NULL), "eval node");
    node = ref_geom_node(ref_geom, node_geom);
    each_ref_geom_having_node(ref_geom, node, item, edge_geom) {
      if (REF_GEOM_EDGE == ref_geom_type(ref_geom, edge_geom) &&
          !ref_facelift_strong_bc(ref_facelift, edge_geom)) {
        RSS(ref_egads_eval(ref_geom, edge_geom, edge_xyz, NULL), "eval face");
        ref_facelift_strong_bc(ref_facelift, edge_geom) = REF_TRUE;
        for (i = 0; i < 3; i++) {
          ref_facelift_displacement(ref_facelift, i, edge_geom) =
              node_xyz[i] - edge_xyz[i];
        }
      }
    }
  }

  for (i = 0; i < 100; i++) RSS(ref_facelift_solve_edge(ref_facelift), "solve");

  return REF_SUCCESS;
}